

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::LoadVariableOperator> *op)

{
  element_type *peVar1;
  char *in_RCX;
  UserDefinedVariableName name;
  
  AppendVariableDeclarationBegin(this);
  peVar1 = (op->super___shared_ptr<const_calc4::LoadVariableOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  name.name._M_str = in_RCX;
  name.name._M_len = (size_t)(peVar1->variableName)._M_dataplus._M_p;
  operator<<((anon_unknown_0 *)this->os,(ostream *)(peVar1->variableName)._M_string_length,name);
  AppendVariableDeclarationEnd(this);
  Return(this,(optional<int>)0x0);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const LoadVariableOperator>& op) override
    {
        AppendVariableDeclarationBegin();
        os << UserDefinedVariableName(op->GetVariableName());
        AppendVariableDeclarationEnd();
        Return();
    }